

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module * __thiscall
pybind11::module::def<std::__cxx11::string(*)(Animal*)>
          (module *this,char *name_,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Animal_ptr **f)

{
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Animal_ptr *f_00;
  handle local_60;
  PyObject *local_58;
  handle local_50;
  handle local_48;
  sibling local_40;
  scope local_38;
  name local_30;
  cpp_function local_28;
  cpp_function func;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Animal_ptr **f_local;
  char *name__local;
  module *this_local;
  
  f_00 = *f;
  func.super_function.super_object.super_handle.m_ptr = (function)(function)f;
  pybind11::name::name(&local_30,name_);
  scope::scope(&local_38,(handle *)this);
  local_50.m_ptr = (this->super_object).super_handle.m_ptr;
  none::none((none *)&local_60);
  local_58 = local_60.m_ptr;
  getattr((pybind11 *)&local_48,local_50,name_,local_60);
  sibling::sibling(&local_40,&local_48);
  cpp_function::
  cpp_function<std::__cxx11::string,Animal*,pybind11::name,pybind11::scope,pybind11::sibling>
            (&local_28,f_00,&local_30,&local_38,&local_40);
  object::~object((object *)&local_48);
  none::~none((none *)&local_60);
  add_object(this,name_,(object *)&local_28,true);
  cpp_function::~cpp_function(&local_28);
  return this;
}

Assistant:

module &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }